

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O2

void __thiscall FPalette::MakeGoodRemap(FPalette *this)

{
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  undefined8 uStack_420;
  PalEntry sortcopy [256];
  
  aVar1 = (anon_union_4_2_12391d7c_for_PalEntry_0)this->BaseColors[0].field_0.d;
  uVar6 = 1;
  do {
    if (uVar6 == 0x100) {
      uVar6 = (ulong)this->Remap[0];
LAB_0048b81d:
      if ((char)uVar6 == '\0') {
        uVar5 = 0;
        for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
          sortcopy[lVar8].field_0 =
               (anon_union_4_2_12391d7c_for_PalEntry_0)(this->BaseColors[lVar8].field_0.d | uVar5);
          uVar5 = uVar5 + 0x1000000;
        }
        uStack_420 = 0x48b857;
        qsort(sortcopy,0x100,4,sortforremap);
        lVar8 = 0x3fc;
        do {
          if (lVar8 == 0) {
            return;
          }
          uVar5 = *(uint *)((long)&sortcopy[-1].field_0 + lVar8);
          uVar2 = *(uint *)((long)&sortcopy[0].field_0 + lVar8);
          lVar8 = lVar8 + -4;
        } while (((uVar5 ^ uVar2) & 0xffffff) != 0);
        bVar4 = (byte)(uVar2 >> 0x18);
        bVar7 = (byte)(uVar5 >> 0x18);
        uVar3 = uVar5 >> 0x18;
        if (bVar4 < bVar7) {
          uVar3 = uVar2 >> 0x18;
        }
        uVar2 = uVar2 >> 0x18;
        if (bVar4 <= bVar7) {
          uVar2 = uVar5 >> 0x18;
        }
        this->Remap[0] = (BYTE)uVar3;
        this->Remap[uVar3] = (BYTE)uVar2;
        this->BaseColors[uVar3].field_0.d = (uint32)aVar1;
      }
      return;
    }
    if (this->BaseColors[uVar6].field_0.d == aVar1.d) {
      this->Remap[0] = (BYTE)uVar6;
      goto LAB_0048b81d;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void FPalette::MakeGoodRemap ()
{
	PalEntry color0 = BaseColors[0];
	int i;

	// First try for an exact match of color 0. Only Hexen does not have one.
	for (i = 1; i < 256; ++i)
	{
		if (BaseColors[i] == color0)
		{
			Remap[0] = i;
			break;
		}
	}

	// If there is no duplicate of color 0, find the first set of duplicate
	// colors and make one of them a duplicate of color 0. In Hexen's PLAYPAL
	// colors 209 and 229 are the only duplicates, but we cannot assume
	// anything because the player might be using a custom PLAYPAL where those
	// entries are not duplicates.
	if (Remap[0] == 0)
	{
		PalEntry sortcopy[256];

		for (i = 0; i < 256; ++i)
		{
			sortcopy[i] = BaseColors[i] | (i << 24);
		}
		qsort (sortcopy, 256, 4, sortforremap);
		for (i = 255; i > 0; --i)
		{
			if ((sortcopy[i] & 0xFFFFFF) == (sortcopy[i-1] & 0xFFFFFF))
			{
				int new0 = sortcopy[i].a;
				int dup = sortcopy[i-1].a;
				if (new0 > dup)
				{
					// Make the lower-numbered entry a copy of color 0. (Just because.)
					swapvalues (new0, dup);
				}
				Remap[0] = new0;
				Remap[new0] = dup;
				BaseColors[new0] = color0;
				break;
			}
		}
	}

	// If there were no duplicates, InitPalette() will remap color 0 to the
	// closest matching color. Hopefully nobody will use a palette where all
	// 256 entries are different. :-)
}